

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-group.c
# Opt level: O0

_Bool monster_group_change_index(chunk *c,wchar_t new,wchar_t old)

{
  wchar_t index;
  wchar_t index_00;
  monster_conflict *pmVar1;
  monster_group_conflict *pmVar2;
  monster_group_conflict *pmVar3;
  mon_group_list_entry_conflict *local_40;
  mon_group_list_entry_conflict *entry;
  monster_group_conflict *group1;
  monster_group_conflict *group0;
  wchar_t index1;
  wchar_t index0;
  wchar_t old_local;
  wchar_t new_local;
  chunk *c_local;
  
  pmVar1 = cave_monster((chunk_conflict *)c,old);
  index = pmVar1->group_info[0].index;
  pmVar1 = cave_monster((chunk_conflict *)c,old);
  index_00 = pmVar1->group_info[1].index;
  pmVar2 = monster_group_by_index(c,index);
  pmVar3 = monster_group_by_index(c,index_00);
  local_40 = pmVar2->member_list;
  if (pmVar2->leader == old) {
    pmVar2->leader = new;
  }
  while( true ) {
    if (local_40 == (mon_group_list_entry_conflict *)0x0) {
      if (pmVar3 != (monster_group_conflict *)0x0) {
        if (pmVar3->leader == old) {
          pmVar3->leader = new;
        }
        for (local_40 = pmVar3->member_list; local_40 != (mon_group_list_entry_conflict *)0x0;
            local_40 = local_40->next) {
          if (local_40->midx == old) {
            local_40->midx = new;
            return true;
          }
        }
      }
      return false;
    }
    if ((local_40->midx == old) && (local_40->midx = new, pmVar3 == (monster_group_conflict *)0x0))
    break;
    local_40 = local_40->next;
  }
  return true;
}

Assistant:

bool monster_group_change_index(struct chunk *c, int new, int old)
{
	int index0 = cave_monster(c, old)->group_info[PRIMARY_GROUP].index;
	int index1 = cave_monster(c, old)->group_info[SUMMON_GROUP].index;
	struct monster_group *group0 = monster_group_by_index(c, index0);
	struct monster_group *group1 = monster_group_by_index(c, index1);
	struct mon_group_list_entry *entry = group0->member_list;

	if (group0->leader == old) {
		group0->leader = new;
	}
	while (entry) {
		if (entry->midx == old) {
			entry->midx = new;
			if (!group1) {
				return true;
			}
		}
		entry = entry->next;
	}

	if (group1) {
		if (group1->leader == old) {
			group1->leader = new;
		}
		entry = group1->member_list;
		while (entry) {
			if (entry->midx == old) {
				entry->midx = new;
				return true;
			}
			entry = entry->next;
		}
	}

	return false;
}